

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O1

void __thiscall DestListHeader::printDestListHeader(DestListHeader *this)

{
  ostream *poVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"____________________DestListHeader______________________",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Version:                            ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,&this->Version);
  Utils::lenFourBytes(&local_40);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"1 - for Windows 7",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    for Windows 8",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"3 - for Windows 10",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"4 - for Windows 10",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_58,&this->TotalNumberOfCurrentEntries);
  Utils::lenFourBytes(&local_58);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70,&this->TotalNumberOfPinnedEntries);
  Utils::lenFourBytes(&local_70);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unknown:                            ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,&this->Unknown);
  Utils::print_vec(&local_88);
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LastIssuedEntryId:                  ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a0,&this->LastIssuedEntryId);
  Utils::vectEightBytesToUnsignedInt(&local_a0,0);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b8,&this->NumberOfAddedDeletedReopened);
  Utils::vectEightBytesToUnsignedInt(&local_b8,0);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_________________________________________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void DestListHeader::printDestListHeader() {
    cout << "____________________DestListHeader______________________" << endl;
    cout << "Version:                            " << dec<< Utils::lenFourBytes(Version) << endl;
        cout << Utils::defaultOffsetDocInfo << "1 - for Windows 7" << endl;
        cout << Utils::defaultOffsetDocInfo << "    for Windows 8" << endl;
        cout << Utils::defaultOffsetDocInfo << "3 - for Windows 10" << endl;
        cout << Utils::defaultOffsetDocInfo << "4 - for Windows 10" << endl;
    cout << "TotalNumberOfCurrentEntries:        " << dec<< Utils::lenFourBytes(TotalNumberOfCurrentEntries) << endl;
    cout << "TotalNumberOfPinnedEntries:         " << dec<< Utils::lenFourBytes(TotalNumberOfPinnedEntries) << endl;
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  " << dec <<
         Utils::vectEightBytesToUnsignedInt(LastIssuedEntryId, 0) << endl;
    cout << "NumberOfAddedDeletedReopened:       " << dec <<
         Utils::vectEightBytesToUnsignedInt(NumberOfAddedDeletedReopened, 0) << endl;
    cout << "_________________________________________________________" << endl;
}